

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

uchar * stb_decompress_token(uchar *i)

{
  byte *in_RDI;
  uint length;
  
  length = (uint)((ulong)in_RDI >> 0x20);
  if (*in_RDI < 0x20) {
    if (*in_RDI < 0x18) {
      if (*in_RDI < 0x10) {
        if (*in_RDI < 8) {
          if (*in_RDI == 7) {
            stb__lit(i,length);
            in_RDI = in_RDI + (int)((uint)in_RDI[1] * 0x100 + (uint)in_RDI[2] + 4);
          }
          else if (*in_RDI == 6) {
            stb__match(i,length);
            in_RDI = in_RDI + 5;
          }
          else if (*in_RDI == 4) {
            stb__match(i,length);
            in_RDI = in_RDI + 6;
          }
        }
        else {
          stb__lit(i,length);
          in_RDI = in_RDI + (int)((uint)*in_RDI * 0x100 + (uint)in_RDI[1] + -0x7fd);
        }
      }
      else {
        stb__match(i,length);
        in_RDI = in_RDI + 5;
      }
    }
    else {
      stb__match(i,length);
      in_RDI = in_RDI + 4;
    }
  }
  else if (*in_RDI < 0x80) {
    if (*in_RDI < 0x40) {
      stb__lit(i,length);
      in_RDI = in_RDI + (int)(*in_RDI - 0x1e);
    }
    else {
      stb__match(i,length);
      in_RDI = in_RDI + 3;
    }
  }
  else {
    stb__match(i,length);
    in_RDI = in_RDI + 2;
  }
  return in_RDI;
}

Assistant:

static const unsigned char *stb_decompress_token(const unsigned char *i)
{
    if (*i >= 0x20) { // use fewer if's for cases that expand small
        if (*i >= 0x80)       stb__match(stb__dout-i[1]-1, i[0] - 0x80 + 1), i += 2;
        else if (*i >= 0x40)  stb__match(stb__dout-(stb__in2(0) - 0x4000 + 1), i[2]+1), i += 3;
        else /* *i >= 0x20 */ stb__lit(i+1, i[0] - 0x20 + 1), i += 1 + (i[0] - 0x20 + 1);
    } else { // more ifs for cases that expand large, since overhead is amortized
        if (*i >= 0x18)       stb__match(stb__dout-(stb__in3(0) - 0x180000 + 1), i[3]+1), i += 4;
        else if (*i >= 0x10)  stb__match(stb__dout-(stb__in3(0) - 0x100000 + 1), stb__in2(3)+1), i += 5;
        else if (*i >= 0x08)  stb__lit(i+2, stb__in2(0) - 0x0800 + 1), i += 2 + (stb__in2(0) - 0x0800 + 1);
        else if (*i == 0x07)  stb__lit(i+3, stb__in2(1) + 1), i += 3 + (stb__in2(1) + 1);
        else if (*i == 0x06)  stb__match(stb__dout-(stb__in3(1)+1), i[4]+1), i += 5;
        else if (*i == 0x04)  stb__match(stb__dout-(stb__in3(1)+1), stb__in2(4)+1), i += 6;
    }
    return i;
}